

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

int __thiscall
QCborContainerPrivate::stringCompareElement<QStringView>
          (QCborContainerPrivate *this,Element *e,QStringView s,Comparison mode)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  QCborContainerPrivate *this_00;
  long in_FS_OFFSET;
  QStringView s_00;
  QStringView local_28;
  QStringView s_local;
  
  s_00.m_size = (storage_type_conflict *)s.m_size;
  s_local.m_data = s.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s_local.m_size = (qsizetype)s_00.m_size;
  if (e->type == String) {
    uVar2._0_4_ = e->type;
    uVar2._4_4_ = e->flags;
    pcVar6 = (this->data).d.ptr;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = &QByteArray::_empty;
    }
    if ((uVar2 >> 0x21 & 1) == 0) {
      uVar5 = -(uint)(s_00.m_size != (storage_type_conflict *)0x0);
    }
    else {
      this_00 = (QCborContainerPrivate *)(pcVar6 + (e->field_0).value);
      if ((uVar2 >> 0x22 & 1) == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          s_00.m_data = s_00.m_size;
          iVar4 = compareUtf8(this_00,(ByteData *)s_local.m_data,s_00);
          return iVar4;
        }
        goto LAB_00142073;
      }
      local_28.m_data = (storage_type_conflict *)&this_00->usedData;
      if (mode == ForEquality) {
        local_28.m_size = *(long *)this_00 / 2;
        bVar3 = comparesEqual(&local_28,&s_local);
        uVar5 = (uint)!bVar3;
      }
      else {
        local_28.m_size = *(long *)this_00 / 2;
        uVar5 = QStringView::compare(&local_28,s,CaseSensitive);
      }
    }
  }
  else {
    uVar5 = e->type + 0xffffffa0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar5;
  }
LAB_00142073:
  __stack_chk_fail();
}

Assistant:

int stringCompareElement(const QtCbor::Element &e, String s, QtCbor::Comparison mode) const
    {
        if (e.type != QCborValue::String)
            return int(e.type) - int(QCborValue::String);

        const QtCbor::ByteData *b = byteData(e);
        if (!b)
            return s.isEmpty() ? 0 : -1;

        if (e.flags & QtCbor::Element::StringIsUtf16) {
            if (mode == QtCbor::Comparison::ForEquality)
                return b->asStringView() == s ? 0 : 1;
            return b->asStringView().compare(s);
        }
        return compareUtf8(b, s);
    }